

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_port.c
# Opt level: O3

int csp_socket_close(csp_socket_t *sock)

{
  int iVar1;
  long lVar2;
  csp_packet_t *packet;
  void *local_18;
  
  if (sock != (csp_socket_t *)0x0) {
    lVar2 = 8;
    do {
      if ((*(int *)(lVar2 + 0x1176a8) == 1) &&
         (*(csp_socket_t **)((long)&ports[0].state + lVar2) == sock)) {
        *(undefined4 *)(lVar2 + 0x1176a8) = 0;
        *(undefined8 *)((long)&ports[0].state + lVar2) = 0;
        break;
      }
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x128);
    if (sock->rx_queue != (csp_queue_handle_t)0x0) {
      local_18 = (void *)0x0;
      iVar1 = csp_queue_dequeue(sock->rx_queue,&local_18,0);
      while (iVar1 == 0) {
        if (local_18 != (void *)0x0) {
          csp_buffer_free(local_18);
        }
        iVar1 = csp_queue_dequeue(sock->rx_queue,&local_18,0);
      }
      csp_queue_free(sock->rx_queue);
    }
  }
  return 0;
}

Assistant:

int csp_socket_close(csp_socket_t * sock) {
	if (sock == NULL) {
		return CSP_ERR_NONE;
	}

	for (size_t i = 0; i < CSP_PORT_MAX_BIND + 2; i++) {
		csp_port_t * port = &ports[i];

		if (port->state == PORT_OPEN && port->socket == sock) {
			port->state = PORT_CLOSED;
			port->socket = NULL;
			break;
		}
	}

	if (sock->rx_queue != NULL) {
		csp_packet_t * packet = NULL;

		while (csp_queue_dequeue(sock->rx_queue, &packet, 0) == CSP_QUEUE_OK) {
			if (packet != NULL) {
				csp_buffer_free(packet);
			}
		}
		csp_queue_free(sock->rx_queue);
	}

	return CSP_ERR_NONE;
}